

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall ON_ObjectRenderingAttributes::Default(ON_ObjectRenderingAttributes *this)

{
  ON_ClassArray<ON_MaterialRef>::SetCapacity((ON_ClassArray<ON_MaterialRef> *)this,0);
  ON_ClassArray<ON_MappingRef>::SetCapacity(&this->m_mappings,0);
  this->m_bCastsShadows = true;
  this->m_bReceivesShadows = true;
  this->m_bits = '\0';
  this->m_reserved1 = '\0';
  return;
}

Assistant:

void ON_ObjectRenderingAttributes::Default()
{
  ON_RenderingAttributes::Default();
  m_mappings.Destroy();
  m_bCastsShadows = true;
  m_bReceivesShadows = true;
  m_bits = 0;
  m_reserved1 = 0;
}